

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DataTypeApplyFromText(char *buf,ImGuiDataType data_type,void *p_data,char *format)

{
  char cVar1;
  size_t __n;
  undefined1 uVar2;
  undefined2 uVar3;
  int iVar4;
  int v32;
  ImGuiDataTypeTempStorage data_backup;
  int local_3c;
  undefined1 local_38 [8];
  
  for (; (cVar1 = *buf, cVar1 == '\t' || (cVar1 == ' ')); buf = buf + 1) {
  }
  if (cVar1 == '\0') {
    return false;
  }
  __n = GDataTypeInfo[data_type].Size;
  memcpy(local_38,p_data,__n);
  if (format == (char *)0x0) {
    format = GDataTypeInfo[data_type].ScanFmt;
  }
  if (data_type - 4U < 6) {
    if ((data_type & 0xeU) == 8) {
      format = GDataTypeInfo[data_type].ScanFmt;
    }
    iVar4 = __isoc99_sscanf(buf,format,p_data);
    if (iVar4 < 1) {
      return false;
    }
    goto switchD_0015e564_default;
  }
  iVar4 = __isoc99_sscanf(buf,format,&local_3c);
  if (iVar4 < 1) {
    return false;
  }
  switch(data_type) {
  case 0:
    iVar4 = 0x7f;
    if (local_3c < 0x7f) {
      iVar4 = local_3c;
    }
    uVar2 = 0x80;
    if (-0x80 < iVar4) {
      uVar2 = (undefined1)iVar4;
    }
    break;
  case 1:
    iVar4 = 0xff;
    if (local_3c < 0xff) {
      iVar4 = local_3c;
    }
    uVar2 = 0;
    if (0 < iVar4) {
      uVar2 = (undefined1)iVar4;
    }
    break;
  case 2:
    iVar4 = 0x7fff;
    if (local_3c < 0x7fff) {
      iVar4 = local_3c;
    }
    uVar3 = 0x8000;
    if (-0x8000 < iVar4) {
      uVar3 = (undefined2)iVar4;
    }
    goto LAB_0015e5b5;
  case 3:
    iVar4 = 0xffff;
    if (local_3c < 0xffff) {
      iVar4 = local_3c;
    }
    uVar3 = 0;
    if (0 < iVar4) {
      uVar3 = (undefined2)iVar4;
    }
LAB_0015e5b5:
    *(undefined2 *)p_data = uVar3;
  default:
    goto switchD_0015e564_default;
  }
  *(undefined1 *)p_data = uVar2;
switchD_0015e564_default:
  iVar4 = bcmp(local_38,p_data,__n);
  return iVar4 != 0;
}

Assistant:

bool ImGui::DataTypeApplyFromText(const char* buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    if (format == NULL)
        format = type_info->ScanFmt;

    if (data_type == ImGuiDataType_S32 || data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64 || data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
    {
        // For float/double we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in, so force them into %f and %lf
        if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
            format = type_info->ScanFmt;
        if (sscanf(buf, format, p_data) < 1)
            return false;
    }
    else
    {
        // Small types need a 32-bit buffer to receive the result from scanf()
        int v32;
        if (sscanf(buf, format, &v32) < 1)
            return false;
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}